

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QPixmap>::moveAppend
          (QGenericArrayOps<QPixmap> *this,QPixmap *b,QPixmap *e)

{
  QPixmap *pQVar1;
  QPlatformPixmap *pQVar2;
  long lVar3;
  QPixmap *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QPixmap>).ptr;
    lVar3 = (this->super_QArrayDataPointer<QPixmap>).size;
    do {
      this_00 = pQVar1 + lVar3;
      QPaintDevice::QPaintDevice(&this_00->super_QPaintDevice);
      (this_00->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_007d25a8;
      pQVar2 = (b->data).d.ptr;
      (b->data).d.ptr = (QPlatformPixmap *)0x0;
      (this_00->data).d.ptr = pQVar2;
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<QPixmap>).size + 1;
      (this->super_QArrayDataPointer<QPixmap>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }